

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

void splitStr(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *rez,char *str,char splitter)

{
  long local_40;
  long local_38;
  char *local_30;
  char *buf;
  char *prevPos;
  char *pcStack_18;
  char splitter_local;
  char *str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rez_local;
  
  prevPos._7_1_ = splitter;
  pcStack_18 = str;
  str_local = (char *)rez;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(rez);
  buf = pcStack_18;
  for (local_30 = pcStack_18; *local_30 != '\0'; local_30 = local_30 + 1) {
    if (*local_30 == prevPos._7_1_) {
      local_38 = (long)local_30 - (long)buf;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&,long>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)str_local,&buf
                 ,&local_38);
      buf = local_30 + 1;
    }
  }
  if (buf < local_30) {
    local_40 = (long)local_30 - (long)buf;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&,long>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)str_local,&buf,
               &local_40);
  }
  return;
}

Assistant:

void splitStr(vector<string>& rez, const char* str, const char splitter)
{
    rez.clear();
    const char* prevPos = str;
    const char* buf = str;
    for (; *buf; buf++)
    {
        if (*buf == splitter)
        {
            rez.emplace_back(prevPos, buf - prevPos);
            prevPos = buf + 1;
        }
    }
    if (buf > prevPos)
        rez.emplace_back(prevPos, buf - prevPos);
}